

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

LispPTR n_new_cursorin(DLword *baseaddr,int dx,int dy,int w,int h)

{
  LispPTR LVar1;
  
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  LVar1 = 0;
  if (((DisplayRegion68k <= baseaddr) && (LVar1 = 0, baseaddr <= DISP_MAX_Address)) &&
     (((int)(*EmMouseX68K + 0x32) <= dx ||
      (((w + dx <= (int)(*EmMouseX68K - 0x32) || ((int)(*EmMouseY68K + 0x32) <= dy)) ||
       (LVar1 = 1, h + dy <= (int)(*EmMouseY68K - 0x32))))))) {
    LVar1 = 0;
  }
  return LVar1;
}

Assistant:

LispPTR n_new_cursorin(DLword *baseaddr, int dx, int dy, int w, int h) {
  extern DLword *DisplayRegion68k;

#ifdef INIT
  init_kbd_startup; /* MUST START KBD FOR INIT BEFORE FIRST BITBLT */
#endif

  if (in_display_segment(baseaddr)) {
    if ((dx < MOUSEXR) && (dx + w > MOUSEXL) && (dy < MOUSEYH) && (dy + h > MOUSEYL))
      return (T);
    else
      return (NIL);
  } else
    return (NIL);
}